

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncTraits.h
# Opt level: O3

int luabridge::detail::Invoke<void,luabridge::detail::TypeList<int,void>,1>::run<void(*)(int)>
              (lua_State *L,_func_void_int **fn)

{
  lua_Integer lVar1;
  
  lVar1 = luaL_checkinteger(L,1);
  (**fn)((int)lVar1);
  return 0;
}

Assistant:

static int run(lua_State* L, Fn& fn)
    {
        try
        {
            ArgList<Params, startParam> args(L);
            FuncTraits<Fn>::call(fn, args);
            return 0;
        }
        catch (const std::exception& e)
        {
            return luaL_error(L, e.what());
        }
    }